

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmTarget *pcVar1;
  char *pcVar2;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator local_141;
  undefined1 local_140 [8];
  string local_138;
  cmGeneratorExpression local_118;
  string local_f8;
  cmGeneratorExpressionDAGChecker local_d8;
  
  std::__cxx11::string::string((string *)&local_d8,"AUTOUIC_OPTIONS",(allocator *)&local_118);
  pcVar2 = GetLinkInterfaceDependentStringProperty(this,(string *)&local_d8,config);
  std::__cxx11::string::~string((string *)&local_d8);
  if (pcVar2 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&local_d8);
    cmGeneratorExpression::cmGeneratorExpression(&local_118,(cmListFileBacktrace *)&local_d8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_d8);
    pcVar1 = this->Target;
    std::__cxx11::string::string((string *)(local_140 + 8),"AUTOUIC_OPTIONS",(allocator *)&local_f8)
    ;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_d8,&pcVar1->Name,(string *)(local_140 + 8),(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)&local_118);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_140,this->LocalGenerator,config,false
                        ,this,&local_d8,&local_f8);
    std::__cxx11::string::string((string *)(local_140 + 8),pcVar2,&local_141);
    cmSystemTools::ExpandListArgument((string *)(local_140 + 8),result,false);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_140);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_d8);
    cmGeneratorExpression::~cmGeneratorExpression(&local_118);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
    this->GetName(), "AUTOUIC_OPTIONS", CM_NULLPTR, CM_NULLPTR);
  cmSystemTools::ExpandListArgument(
    ge.Parse(prop)->Evaluate(this->LocalGenerator, config, false, this,
                             &dagChecker),
    result);
}